

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,int nbQubits)

{
  int nbQubits_local;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this_local;
  
  QObject<std::complex<float>_>::QObject(&this->super_QObject<std::complex<float>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,false);
  (this->super_QObject<std::complex<float>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_00158498;
  this->nbQubits_ = nbQubits;
  this->offset_ = 0;
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ::vector(&this->gates_);
  if (0 < nbQubits) {
    return;
  }
  __assert_fail("nbQubits > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/QCircuit.hpp"
                ,0x34,
                "qclab::QCircuit<std::complex<float>>::QCircuit(const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
               );
}

Assistant:

QCircuit( const int nbQubits )
      : nbQubits_( nbQubits )
      , offset_( 0 )
      {
        assert( nbQubits > 0 ) ;
      }